

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_tools.cpp
# Opt level: O0

void __thiscall dlib::tt::tensor_rand::fill_uniform(tensor_rand *this,tensor *data)

{
  rand *this_00;
  float fVar1;
  float *x;
  iterator __end2;
  iterator __begin2;
  tensor *__range2;
  tensor *in_stack_ffffffffffffffd0;
  rand *prVar2;
  rand *local_20;
  
  local_20 = (rand *)tensor::begin((tensor *)0x277b7b);
  this_00 = (rand *)tensor::end(in_stack_ffffffffffffffd0);
  for (; local_20 != this_00; local_20 = (rand *)((long)&local_20->_vptr_rand + 4)) {
    prVar2 = local_20;
    fVar1 = rand::get_random_float(this_00);
    *(float *)&prVar2->_vptr_rand = fVar1;
  }
  return;
}

Assistant:

void tensor_rand::
    fill_uniform (
        tensor& data
    )
    {
#ifdef DLIB_USE_CUDA
        rnd.fill_uniform(data);
#else
        for (auto& x : data) 
            x = rnd.get_random_float();
#endif
    }